

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

void __thiscall PSEngine::load_next_level(PSEngine *this)

{
  int iVar1;
  Operation op;
  long *local_78;
  long local_70;
  long local_68 [2];
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  iVar1 = (this->m_current_level).level_idx;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_58._0_4_ = LoadLevel;
  local_58._4_4_ = None;
  local_58._8_4_ = -1;
  local_58._12_4_ = -1.0;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_78,local_70 + (long)local_78);
  iVar1 = iVar1 + 1;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_58._8_4_ = iVar1;
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
            (&this->m_operation_history,(value_type *)local_58);
  load_level_internal(this,iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PSEngine::load_next_level()
{
    int next_level_idx = m_current_level.level_idx + 1;

    Operation op = Operation(OperationType::LoadLevel);
    op.loaded_level = next_level_idx;
    m_operation_history.push_back(op);

    load_level_internal(next_level_idx);
}